

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamStandardIndex::CheckMagicNumber(BamStandardIndex *this)

{
  int iVar1;
  undefined8 uVar2;
  long in_RDI;
  int64_t numBytesRead;
  char magic [4];
  allocator local_c1;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  BamException *in_stack_ffffffffffffff50;
  allocator local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  long local_18;
  char local_c [12];
  
  local_18 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x28))(*(long **)(in_RDI + 0x58),local_c,4);
  if (local_18 != 4) {
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"BamStandardIndex::CheckMagicNumber",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"could not read BAI magic number",&local_71);
    BamException::BamException
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    local_72 = 0;
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  iVar1 = strncmp(local_c,"BAI\x01",4);
  if (iVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"BamStandardIndex::CheckMagicNumber",&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff40,"invalid BAI magic number",&local_c1);
    BamException::BamException
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::CheckMagicNumber()
{

    // check 'magic number' to see if file is BAI index
    char magic[4];
    const int64_t numBytesRead = m_resources.Device->Read(magic, sizeof(magic));
    if (numBytesRead != 4)
        throw BamException("BamStandardIndex::CheckMagicNumber", "could not read BAI magic number");

    // compare to expected value
    if (strncmp(magic, BamStandardIndex::BAI_MAGIC, 4) != 0)
        throw BamException("BamStandardIndex::CheckMagicNumber", "invalid BAI magic number");
}